

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t *
container_andnot(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type)

{
  _Bool _Var1;
  uint8_t uVar2;
  array_container_t *paVar4;
  array_container_t *src_2;
  array_container_t *dst;
  byte local_3a;
  byte local_39;
  array_container_t *local_38;
  int iVar3;
  
  local_3a = type2;
  local_39 = type1;
  paVar4 = (array_container_t *)container_unwrap_shared(c1,&local_39);
  src_2 = (array_container_t *)container_unwrap_shared(c2,&local_3a);
  local_38 = (array_container_t *)0x0;
  switch((uint)local_3a + (uint)local_39 * 4) {
  case 5:
    _Var1 = bitset_bitset_container_andnot
                      ((bitset_container_t *)paVar4,(bitset_container_t *)src_2,&local_38);
    break;
  case 6:
    _Var1 = bitset_array_container_andnot((bitset_container_t *)paVar4,src_2,&local_38);
    break;
  case 7:
    _Var1 = run_container_is_full((run_container_t *)src_2);
    if (_Var1) {
LAB_00109f11:
      paVar4 = array_container_create();
      *result_type = '\x02';
      return paVar4;
    }
    _Var1 = bitset_run_container_andnot
                      ((bitset_container_t *)paVar4,(run_container_t *)src_2,&local_38);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1777,
                  "container_t *container_andnot(const container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  case 9:
    dst = array_container_create();
    array_bitset_container_andnot(paVar4,(bitset_container_t *)src_2,dst);
    goto LAB_00109f48;
  case 10:
    dst = array_container_create();
    array_container_andnot(paVar4,src_2,dst);
    goto LAB_00109f48;
  case 0xb:
    _Var1 = run_container_is_full((run_container_t *)src_2);
    dst = array_container_create();
    if (!_Var1) {
      array_run_container_andnot(paVar4,(run_container_t *)src_2,dst);
    }
LAB_00109f48:
    *result_type = '\x02';
    return dst;
  case 0xd:
    _Var1 = run_bitset_container_andnot
                      ((run_container_t *)paVar4,(bitset_container_t *)src_2,&local_38);
    break;
  case 0xe:
    iVar3 = run_array_container_andnot((run_container_t *)paVar4,src_2,&local_38);
    uVar2 = (uint8_t)iVar3;
    goto LAB_00109f2e;
  case 0xf:
    _Var1 = run_container_is_full((run_container_t *)src_2);
    if (_Var1) goto LAB_00109f11;
    iVar3 = run_run_container_andnot((run_container_t *)paVar4,(run_container_t *)src_2,&local_38);
    uVar2 = (uint8_t)iVar3;
LAB_00109f2e:
    *result_type = uVar2;
    return local_38;
  }
  *result_type = '\x02' - _Var1;
  return local_38;
}

Assistant:

static inline container_t *container_andnot(
    const container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    c1 = container_unwrap_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    container_t *result = NULL;
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
            *result_type = bitset_bitset_container_andnot(
                                const_CAST_bitset(c1),
                                const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,ARRAY):
            result = array_container_create();
            array_array_container_andnot(const_CAST_array(c1),
                                         const_CAST_array(c2),
                                         CAST_array(result));
            *result_type = ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,RUN):
            if (run_container_is_full(const_CAST_run(c2))) {
                result = array_container_create();
                *result_type = ARRAY_CONTAINER_TYPE;
                return result;
            }
            *result_type =
                run_run_container_andnot(const_CAST_run(c1),
                                         const_CAST_run(c2), &result);
            return result;

        case CONTAINER_PAIR(BITSET,ARRAY):
            *result_type = bitset_array_container_andnot(
                                const_CAST_bitset(c1),
                                const_CAST_array(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,BITSET):
            result = array_container_create();
            array_bitset_container_andnot(const_CAST_array(c1),
                                          const_CAST_bitset(c2),
                                          CAST_array(result));
            *result_type = ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(BITSET,RUN):
            if (run_container_is_full(const_CAST_run(c2))) {
                result = array_container_create();
                *result_type = ARRAY_CONTAINER_TYPE;
                return result;
            }
            *result_type = bitset_run_container_andnot(
                                const_CAST_bitset(c1),
                                const_CAST_run(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,BITSET):
            *result_type = run_bitset_container_andnot(
                                const_CAST_run(c1),
                                const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,RUN):
            if (run_container_is_full(const_CAST_run(c2))) {
                result = array_container_create();
                *result_type = ARRAY_CONTAINER_TYPE;
                return result;
            }
            result = array_container_create();
            array_run_container_andnot(const_CAST_array(c1),
                                       const_CAST_run(c2),
                                       CAST_array(result));
            *result_type = ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,ARRAY):
            *result_type = run_array_container_andnot(
                const_CAST_run(c1), const_CAST_array(c2),
                &result);
            return result;

        default:
            assert(false);
            __builtin_unreachable();
            return NULL;  // unreached
    }
}